

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vl53l1x.cpp
# Opt level: O2

void __thiscall VL53L1X::readResults(VL53L1X *this)

{
  uint8_t uVar1;
  uint16_t uVar2;
  
  uVar1 = readReg(this,0x89);
  (this->results).range_status = uVar1;
  uVar1 = readReg(this,0x8b);
  (this->results).stream_count = uVar1;
  uVar2 = readReg16Bit(this,0x8c);
  (this->results).dss_actual_effective_spads_sd0 = uVar2;
  uVar2 = readReg16Bit(this,0x90);
  (this->results).ambient_count_rate_mcps_sd0 = uVar2;
  uVar2 = readReg16Bit(this,0x96);
  (this->results).final_crosstalk_corrected_range_mm_sd0 = uVar2;
  uVar2 = readReg16Bit(this,0x98);
  (this->results).peak_signal_count_rate_crosstalk_corrected_mcps_sd0 = uVar2;
  return;
}

Assistant:

void VL53L1X::readResults()
{
  results.range_status = this->readReg(VL53L1X_DEFINITIONS::RESULT__RANGE_STATUS);
  results.stream_count = this->readReg(VL53L1X_DEFINITIONS::RESULT__STREAM_COUNT);
  results.dss_actual_effective_spads_sd0 = this->readReg16Bit(VL53L1X_DEFINITIONS::RESULT__DSS_ACTUAL_EFFECTIVE_SPADS_SD0);
  results.ambient_count_rate_mcps_sd0 = this->readReg16Bit(VL53L1X_DEFINITIONS::RESULT__AMBIENT_COUNT_RATE_MCPS_SD0);
  results.final_crosstalk_corrected_range_mm_sd0 = this->readReg16Bit(VL53L1X_DEFINITIONS::RESULT__FINAL_CROSSTALK_CORRECTED_RANGE_MM_SD0);
  results.peak_signal_count_rate_crosstalk_corrected_mcps_sd0 = this->readReg16Bit(VL53L1X_DEFINITIONS::RESULT__PEAK_SIGNAL_COUNT_RATE_CROSSTALK_CORRECTED_MCPS_SD0);
}